

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O3

int wally_ec_sig_to_public_key
              (uchar *bytes,size_t bytes_len,uchar *sig,size_t sig_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  size_t len_in_out;
  secp256k1_pubkey pub;
  secp256k1_ecdsa_recoverable_signature sig_secp;
  size_t local_c0;
  secp256k1_pubkey local_b1;
  secp256k1_ecdsa_recoverable_signature local_71;
  
  ctx = secp_ctx();
  local_c0 = 0x21;
  if (ctx == (secp256k1_context_struct *)0x0) {
    iVar2 = -3;
  }
  else {
    iVar2 = -2;
    if ((len == 0x21 && bytes_out != (uchar *)0x0) &&
        ((sig_len == 0x41 && bytes_len == 0x20) && (sig != (uchar *)0x0 && bytes != (uchar *)0x0)))
    {
      iVar1 = secp256k1_ecdsa_recoverable_signature_parse_compact
                        (ctx,&local_71,sig + 1,(uint)(*sig + 1 & 3));
      iVar2 = -2;
      if (iVar1 != 0) {
        iVar1 = secp256k1_ecdsa_recover(ctx,&local_b1,&local_71,bytes);
        if (iVar1 != 0) {
          iVar2 = pubkey_serialize(bytes_out,&local_c0,&local_b1,0x102);
          iVar2 = (uint)(iVar2 != 0) * 2 + -2;
        }
      }
      wally_clear_2(&local_b1,0x40,&local_71,0x41);
    }
  }
  return iVar2;
}

Assistant:

int wally_ec_sig_to_public_key(const unsigned char *bytes, size_t bytes_len,
                               const unsigned char *sig, size_t sig_len,
                               unsigned char *bytes_out, size_t len)
{
    secp256k1_pubkey pub;
    secp256k1_ecdsa_recoverable_signature sig_secp;
    const secp256k1_context *ctx = secp_ctx();
    size_t len_in_out = EC_PUBLIC_KEY_LEN;
    int recid;
    bool ok;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !sig || sig_len != EC_SIGNATURE_RECOVERABLE_LEN ||
        !bytes_out || len != EC_PUBLIC_KEY_LEN)
        return WALLY_EINVAL;

    recid = (sig[0] - 27) & 3;
    ok = secp256k1_ecdsa_recoverable_signature_parse_compact(ctx, &sig_secp, &sig[1], recid) &&
         secp256k1_ecdsa_recover(ctx, &pub, &sig_secp, bytes) &&
         pubkey_serialize(bytes_out, &len_in_out, &pub, PUBKEY_COMPRESSED);

    wally_clear_2(&pub, sizeof(pub), &sig_secp, sizeof(sig_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}